

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrtran.c
# Opt level: O2

void png_do_read_transformations(png_structrp png_ptr,png_row_infop row_info)

{
  byte bVar1;
  ushort uVar2;
  png_colorp ppVar3;
  png_uint_16pp pppVar4;
  png_bytep ppVar5;
  png_uint_16pp pppVar6;
  png_uint_16pp pppVar7;
  size_t sVar8;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  png_uint_32 pVar12;
  png_bytep bp;
  byte *pbVar13;
  png_bytep ppVar14;
  png_byte pVar15;
  sbyte sVar16;
  ushort uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  byte *pbVar21;
  png_byte *ppVar22;
  png_const_color_16p trans_color;
  png_bytep ppVar23;
  ushort uVar24;
  png_uint_16 pVar25;
  uint uVar26;
  ushort *puVar27;
  ushort uVar28;
  ushort uVar29;
  ushort *puVar30;
  long lVar31;
  png_uint_16 *ppVar32;
  png_byte *ppVar33;
  char *error_message;
  png_byte pVar34;
  long lVar35;
  byte bVar36;
  uint uVar37;
  byte bVar38;
  char cVar39;
  int iVar40;
  byte *pbVar41;
  png_uint_16 *ppVar42;
  ulong uVar43;
  ushort uVar44;
  uint uVar45;
  int iVar46;
  uint uVar47;
  ushort *puVar48;
  bool bVar49;
  undefined1 auVar50 [16];
  int local_58 [4];
  png_row_infop local_48;
  ulong local_40;
  png_uint_16pp local_38;
  
  ppVar23 = png_ptr->row_buf;
  if (ppVar23 == (png_bytep)0x0) {
    error_message = "NULL row buffer";
    goto LAB_0011314c;
  }
  if ((png_ptr->flags & 0x4040) == 0x4000) {
    error_message = "Uninitialized row";
    goto LAB_0011314c;
  }
  if ((png_ptr->transformations >> 0xc & 1) != 0) {
    if (row_info->color_type == '\x03') {
      ppVar3 = png_ptr->palette;
      ppVar14 = png_ptr->trans_alpha;
      uVar24 = png_ptr->num_trans;
      uVar37 = row_info->width;
      uVar19 = (ulong)uVar37;
      bVar11 = row_info->bit_depth;
      if (bVar11 < 8) {
        if (bVar11 == 1) {
          pbVar41 = ppVar23 + (ulong)(uVar37 - 1 >> 3) + 1;
          uVar18 = -uVar37 & 7;
          for (uVar43 = uVar19; (int)uVar43 != 0; uVar43 = uVar43 - 1) {
            ppVar23[uVar43] = (*pbVar41 >> (uVar18 & 0x1f) & 1) != 0;
            bVar49 = uVar18 == 7;
            uVar18 = uVar18 + 1;
            if (bVar49) {
              uVar18 = 0;
            }
            pbVar41 = pbVar41 + -(ulong)bVar49;
          }
        }
        else if (bVar11 == 2) {
          pbVar41 = ppVar23 + (ulong)(uVar37 - 1 >> 2) + 1;
          uVar18 = ~(uVar37 * 2 + 6) & 6;
          for (uVar43 = uVar19; (int)uVar43 != 0; uVar43 = uVar43 - 1) {
            ppVar23[uVar43] = *pbVar41 >> ((byte)uVar18 & 0x1f) & 3;
            bVar49 = uVar18 == 6;
            uVar18 = uVar18 + 2;
            if (bVar49) {
              uVar18 = 0;
            }
            pbVar41 = pbVar41 + -(ulong)bVar49;
          }
        }
        else if (bVar11 == 4) {
          pbVar41 = ppVar23 + (ulong)(uVar37 - 1 >> 1) + 1;
          uVar18 = uVar37 * 4 & 4;
          for (uVar43 = uVar19; (int)uVar43 != 0; uVar43 = uVar43 - 1) {
            ppVar23[uVar43] = *pbVar41 >> ((byte)uVar18 & 0x1f) & 0xf;
            bVar49 = uVar18 == 4;
            uVar18 = uVar18 + 4;
            if (bVar49) {
              uVar18 = 0;
            }
            pbVar41 = pbVar41 + -(ulong)bVar49;
          }
        }
        row_info->bit_depth = '\b';
        row_info->pixel_depth = '\b';
        row_info->rowbytes = uVar19;
      }
      else if (bVar11 != 8) goto LAB_00110e07;
      if (uVar24 == 0) {
        uVar20 = (ulong)(uVar37 * 3);
        uVar43 = uVar20;
        for (; (int)uVar19 != 0; uVar19 = uVar19 - 1) {
          ppVar23[uVar43] = ppVar3[ppVar23[uVar19]].blue;
          ppVar23[uVar43 - 1] = ppVar3[ppVar23[uVar19]].green;
          ppVar23[uVar43 - 2] = ppVar3[ppVar23[uVar19]].red;
          uVar43 = uVar43 - 3;
        }
        row_info->bit_depth = '\b';
        row_info->pixel_depth = '\x18';
        pVar15 = '\x03';
        pVar34 = '\x02';
      }
      else {
        for (; (int)uVar19 != 0; uVar19 = uVar19 - 1) {
          pVar15 = 0xff;
          if (ppVar23[uVar19] < uVar24) {
            pVar15 = ppVar14[ppVar23[uVar19]];
          }
          ppVar23[uVar19 * 4] = pVar15;
          ppVar23[uVar19 * 4 + -1] = ppVar3[ppVar23[uVar19]].blue;
          ppVar23[uVar19 * 4 + -2] = ppVar3[ppVar23[uVar19]].green;
          ppVar23[uVar19 * 4 + -3] = ppVar3[ppVar23[uVar19]].red;
        }
        row_info->bit_depth = '\b';
        row_info->pixel_depth = ' ';
        uVar20 = (ulong)(uVar37 * 4);
        pVar15 = '\x04';
        pVar34 = '\x06';
      }
      row_info->rowbytes = uVar20;
      row_info->color_type = pVar34;
      row_info->channels = pVar15;
    }
    else {
      if (((png_ptr->transformations >> 0x19 & 1) == 0) || (png_ptr->num_trans == 0)) {
        trans_color = (png_const_color_16p)0x0;
      }
      else {
        trans_color = &png_ptr->trans_color;
      }
      png_do_expand(row_info,ppVar23 + 1,trans_color);
    }
  }
LAB_00110e07:
  uVar37 = png_ptr->transformations;
  if (((uVar37 & 0x40080) == 0x40000) && ((row_info->color_type | 2) == 6)) {
    png_do_strip_channel(row_info,png_ptr->row_buf + 1,0);
    uVar37 = png_ptr->transformations;
  }
  if (((uVar37 & 0x600000) != 0) && (bVar11 = row_info->color_type, (bVar11 & 3) == 2)) {
    puVar30 = (ushort *)(png_ptr->row_buf + 1);
    uVar24 = png_ptr->rgb_to_gray_red_coeff;
    uVar28 = png_ptr->rgb_to_gray_green_coeff;
    iVar40 = (0x8000 - (uint)uVar24) - (uint)uVar28;
    local_40 = (ulong)row_info->width;
    uVar37 = (uint)uVar24;
    uVar18 = (uint)uVar28;
    if (row_info->bit_depth == '\b') {
      ppVar23 = png_ptr->gamma_from_1;
      if ((ppVar23 == (png_bytep)0x0) || (ppVar14 = png_ptr->gamma_to_1, ppVar14 == (png_bytep)0x0))
      {
        bVar49 = false;
        uVar19 = local_40;
        puVar48 = puVar30;
        while (iVar46 = (int)uVar19, uVar19 = (ulong)(iVar46 - 1), iVar46 != 0) {
          bVar36 = (byte)*puVar48;
          if (bVar36 != (byte)puVar48[1] || *(byte *)((long)puVar48 + 1) != bVar36) {
            bVar36 = (byte)((uint)(byte)puVar48[1] * iVar40 +
                            *(byte *)((long)puVar48 + 1) * uVar18 + bVar36 * uVar37 >> 0xf);
            bVar49 = true;
          }
          *(byte *)puVar30 = bVar36;
          if ((bVar11 & 4) == 0) {
            puVar48 = (ushort *)((long)puVar48 + 3);
            puVar30 = (ushort *)((long)puVar30 + 1);
          }
          else {
            pbVar41 = (byte *)((long)puVar48 + 3);
            puVar48 = puVar48 + 2;
            *(byte *)((long)puVar30 + 1) = *pbVar41;
            puVar30 = puVar30 + 1;
          }
        }
      }
      else {
        local_48 = row_info;
        bVar49 = false;
        uVar19 = local_40;
        puVar48 = puVar30;
        while (iVar46 = (int)uVar19, uVar19 = (ulong)(iVar46 - 1), iVar46 != 0) {
          bVar36 = (byte)*puVar48;
          if (bVar36 == (byte)puVar48[1] && *(byte *)((long)puVar48 + 1) == bVar36) {
            if (png_ptr->gamma_table != (png_bytep)0x0) {
              pbVar41 = png_ptr->gamma_table + bVar36;
              goto LAB_00110f5d;
            }
          }
          else {
            pbVar41 = ppVar23 + ((uint)ppVar14[(byte)puVar48[1]] * iVar40 +
                                 ppVar14[*(byte *)((long)puVar48 + 1)] * uVar18 +
                                 ppVar14[bVar36] * uVar37 + 0x4000 >> 0xf);
            bVar49 = true;
LAB_00110f5d:
            bVar36 = *pbVar41;
          }
          *(byte *)puVar30 = bVar36;
          if ((bVar11 & 4) == 0) {
            puVar48 = (ushort *)((long)puVar48 + 3);
            puVar30 = (ushort *)((long)puVar30 + 1);
          }
          else {
            pbVar41 = (byte *)((long)puVar48 + 3);
            puVar48 = puVar48 + 2;
            *(byte *)((long)puVar30 + 1) = *pbVar41;
            puVar30 = puVar30 + 1;
          }
        }
      }
    }
    else {
      pppVar4 = png_ptr->gamma_16_to_1;
      if (pppVar4 != (png_uint_16pp)0x0) {
        local_38 = png_ptr->gamma_16_from_1;
        if (local_38 != (png_uint_16pp)0x0) {
          local_48 = row_info;
          bVar49 = false;
          uVar19 = local_40;
          puVar48 = puVar30;
          while (iVar46 = (int)uVar19, uVar19 = (ulong)(iVar46 - 1), iVar46 != 0) {
            uVar29 = *puVar30;
            uVar2 = puVar30[2];
            uVar17 = uVar29 << 8 | uVar29 >> 8;
            bVar36 = (byte)puVar30[1];
            bVar38 = *(byte *)((long)puVar30 + 3);
            uVar44 = uVar2 << 8 | uVar2 >> 8;
            if (((uint)CONCAT11(bVar36,bVar38) == (uint)uVar17) && (uVar17 == uVar44)) {
              if (png_ptr->gamma_16_table != (png_uint_16pp)0x0) {
                puVar27 = (ushort *)
                          ((ulong)((uint)bVar36 + (uint)bVar36) +
                          (long)png_ptr->gamma_16_table
                                [bVar38 >> ((byte)png_ptr->gamma_shift & 0x1f)]);
                goto LAB_001110b2;
              }
            }
            else {
              bVar1 = (byte)png_ptr->gamma_shift;
              uVar37 = (uint)pppVar4[bVar38 >> (bVar1 & 0x1f)][bVar36] * (uint)uVar28 +
                       (uint)pppVar4[(uVar17 & 0xff) >> (bVar1 & 0x1f)][uVar29 & 0xff] *
                       (uint)uVar24 +
                       (uint)pppVar4[(uVar44 & 0xff) >> (bVar1 & 0x1f)][uVar2 & 0xff] * iVar40 +
                       0x4000;
              puVar27 = (ushort *)
                        ((ulong)(uVar37 >> 0x16 & 0x1fe) +
                        (long)local_38[(uVar37 >> 0xf & 0xff) >> (bVar1 & 0x1f)]);
              bVar49 = true;
LAB_001110b2:
              uVar17 = *puVar27;
            }
            *puVar48 = uVar17 << 8 | uVar17 >> 8;
            if ((bVar11 & 4) == 0) {
              puVar30 = puVar30 + 3;
              puVar48 = puVar48 + 1;
            }
            else {
              *(byte *)(puVar48 + 1) = (byte)puVar30[3];
              pbVar41 = (byte *)((long)puVar30 + 7);
              puVar30 = puVar30 + 4;
              *(byte *)((long)puVar48 + 3) = *pbVar41;
              puVar48 = puVar48 + 2;
            }
          }
          goto LAB_001110ef;
        }
      }
      bVar49 = false;
      uVar19 = local_40;
      puVar48 = puVar30;
      while (iVar46 = (int)uVar19, uVar19 = (ulong)(iVar46 - 1), iVar46 != 0) {
        uVar24 = *puVar30 << 8 | *puVar30 >> 8;
        uVar28 = puVar30[1] << 8 | puVar30[1] >> 8;
        uVar29 = puVar30[2] << 8 | puVar30[2] >> 8;
        if (uVar24 != uVar29 || uVar24 != uVar28) {
          bVar49 = true;
        }
        uVar26 = (uint)uVar29 * iVar40 + uVar28 * uVar18 + uVar24 * uVar37 + 0x4000;
        *(byte *)puVar48 = (byte)(uVar26 >> 0x17);
        *(byte *)((long)puVar48 + 1) = (byte)(uVar26 >> 0xf);
        if ((bVar11 & 4) == 0) {
          puVar30 = puVar30 + 3;
          puVar48 = puVar48 + 1;
        }
        else {
          *(byte *)(puVar48 + 1) = (byte)puVar30[3];
          pbVar41 = (byte *)((long)puVar30 + 7);
          puVar30 = puVar30 + 4;
          *(byte *)((long)puVar48 + 3) = *pbVar41;
          puVar48 = puVar48 + 2;
        }
      }
    }
LAB_001110ef:
    pVar15 = row_info->channels + 0xfe;
    row_info->channels = pVar15;
    row_info->color_type = row_info->color_type & 0xfd;
    bVar11 = row_info->bit_depth * pVar15;
    row_info->pixel_depth = bVar11;
    if (bVar11 < 8) {
      uVar19 = bVar11 * local_40 + 7 >> 3;
    }
    else {
      uVar19 = (bVar11 >> 3) * local_40;
    }
    row_info->rowbytes = uVar19;
    uVar37 = png_ptr->transformations;
    if (bVar49) {
      png_ptr->rgb_to_gray_status = '\x01';
      if ((uVar37 & 0x600000) == 0x400000) {
        png_warning(png_ptr,"png_do_rgb_to_gray found nongray pixel");
        uVar37 = png_ptr->transformations;
      }
      if ((uVar37 & 0x600000) == 0x200000) {
        error_message = "png_do_rgb_to_gray found nongray pixel";
        goto LAB_0011314c;
      }
    }
  }
  if (((uVar37 >> 0xe & 1) != 0) && ((png_ptr->mode & 0x800) == 0)) {
    png_do_gray_to_rgb(row_info,png_ptr->row_buf + 1);
    uVar37 = png_ptr->transformations;
  }
  if (((char)uVar37 < '\0') && (row_info->color_type < 7)) {
    pbVar13 = png_ptr->row_buf;
    pbVar41 = pbVar13 + 1;
    ppVar23 = png_ptr->gamma_table;
    ppVar14 = png_ptr->gamma_from_1;
    ppVar5 = png_ptr->gamma_to_1;
    pppVar4 = png_ptr->gamma_16_table;
    pppVar6 = png_ptr->gamma_16_from_1;
    pppVar7 = png_ptr->gamma_16_to_1;
    uVar37 = png_ptr->flags;
    pVar12 = row_info->width;
    bVar11 = (byte)png_ptr->gamma_shift;
    switch(row_info->color_type) {
    case '\0':
      switch(row_info->bit_depth) {
      case '\x01':
        uVar37 = 7;
        while (bVar49 = pVar12 != 0, pVar12 = pVar12 - 1, bVar49) {
          if ((ushort)((*pbVar41 >> (uVar37 & 0x1f) & 1) != 0) == (png_ptr->trans_color).gray) {
            *pbVar41 = (byte)(*(int *)&(png_ptr->background).gray << ((byte)uVar37 & 0x1f)) |
                       (byte)(0x7f7f >> (7 - (byte)uVar37 & 0x1f)) & *pbVar41;
          }
          bVar49 = uVar37 == 0;
          uVar37 = uVar37 - 1;
          if (bVar49) {
            uVar37 = 7;
          }
          pbVar41 = pbVar41 + bVar49;
        }
        break;
      case '\x02':
        iVar40 = 6;
        if (ppVar23 == (png_bytep)0x0) {
          while (bVar49 = pVar12 != 0, pVar12 = pVar12 - 1, bVar49) {
            bVar11 = (byte)iVar40;
            if ((*pbVar41 >> (bVar11 & 0x1f) & 3) == (png_ptr->trans_color).gray) {
              *pbVar41 = (byte)(*(int *)&(png_ptr->background).gray << (bVar11 & 0x1f)) |
                         (byte)(0x3f3f >> (6 - bVar11 & 0x1f)) & *pbVar41;
            }
            bVar49 = iVar40 == 0;
            iVar40 = iVar40 + -2;
            if (bVar49) {
              iVar40 = 6;
            }
            pbVar41 = pbVar41 + bVar49;
          }
        }
        else {
          while (bVar49 = pVar12 != 0, pVar12 = pVar12 - 1, bVar49) {
            bVar11 = (byte)iVar40;
            uVar37 = *pbVar41 >> (bVar11 & 0x1f) & 3;
            if (uVar37 == (png_ptr->trans_color).gray) {
              uVar37 = (uint)(png_ptr->background).gray;
            }
            else {
              uVar37 = (uint)(ppVar23[(ulong)uVar37 * 0x55] >> 6);
            }
            *pbVar41 = (byte)(uVar37 << (bVar11 & 0x1f)) |
                       (byte)(0x3f3f >> (6 - bVar11 & 0x1f)) & *pbVar41;
            bVar49 = iVar40 == 0;
            iVar40 = iVar40 + -2;
            if (bVar49) {
              iVar40 = 6;
            }
            pbVar41 = pbVar41 + bVar49;
          }
        }
        break;
      case '\x03':
      case '\x05':
      case '\x06':
      case '\a':
        break;
      case '\x04':
        iVar40 = 4;
        if (ppVar23 == (png_bytep)0x0) {
          while (bVar49 = pVar12 != 0, pVar12 = pVar12 - 1, bVar49) {
            bVar11 = (byte)iVar40;
            if ((*pbVar41 >> (bVar11 & 0x1f) & 0xf) == (png_ptr->trans_color).gray) {
              *pbVar41 = (byte)(*(int *)&(png_ptr->background).gray << (bVar11 & 0x1f)) |
                         (byte)(0xf0f >> (4 - bVar11 & 0x1f)) & *pbVar41;
            }
            bVar49 = iVar40 == 0;
            iVar40 = iVar40 + -4;
            if (bVar49) {
              iVar40 = 4;
            }
            pbVar41 = pbVar41 + bVar49;
          }
        }
        else {
          while (bVar49 = pVar12 != 0, pVar12 = pVar12 - 1, bVar49) {
            bVar11 = (byte)iVar40;
            uVar37 = *pbVar41 >> (bVar11 & 0x1f) & 0xf;
            if (uVar37 == (png_ptr->trans_color).gray) {
              uVar37 = (uint)(png_ptr->background).gray;
            }
            else {
              uVar37 = (uint)(ppVar23[(ulong)uVar37 * 0x11] >> 4);
            }
            *pbVar41 = (byte)(uVar37 << (bVar11 & 0x1f)) |
                       (byte)(0xf0f >> (4 - bVar11 & 0x1f)) & *pbVar41;
            bVar49 = iVar40 == 0;
            iVar40 = iVar40 + -4;
            if (bVar49) {
              iVar40 = 4;
            }
            pbVar41 = pbVar41 + bVar49;
          }
        }
        break;
      case '\b':
        lVar31 = 0;
        if (ppVar23 == (png_bytep)0x0) {
          for (; pVar12 != (png_uint_32)lVar31; lVar31 = lVar31 + 1) {
            if ((png_ptr->trans_color).gray == (ushort)pbVar41[lVar31]) {
              pbVar41[lVar31] = (byte)(png_ptr->background).gray;
            }
          }
        }
        else {
          for (; pVar12 != (png_uint_32)lVar31; lVar31 = lVar31 + 1) {
            if ((png_ptr->trans_color).gray == (ushort)pbVar41[lVar31]) {
              bVar11 = (byte)(png_ptr->background).gray;
            }
            else {
              bVar11 = ppVar23[(ushort)pbVar41[lVar31]];
            }
            pbVar41[lVar31] = bVar11;
          }
        }
        break;
      default:
        if (row_info->bit_depth == '\x10') {
          ppVar32 = &(png_ptr->background).gray;
          if (pppVar4 == (png_uint_16pp)0x0) {
            for (lVar31 = 0; pVar12 != (png_uint_32)lVar31; lVar31 = lVar31 + 1) {
              if ((ushort)(*(ushort *)(pbVar13 + lVar31 * 2 + 1) << 8 |
                          *(ushort *)(pbVar13 + lVar31 * 2 + 1) >> 8) == (png_ptr->trans_color).gray
                 ) {
                uVar24 = *ppVar32;
                *(ushort *)(pbVar13 + lVar31 * 2 + 1) = uVar24 << 8 | uVar24 >> 8;
              }
            }
          }
          else {
            for (lVar31 = 0; pVar12 != (png_uint_32)lVar31; lVar31 = lVar31 + 1) {
              bVar36 = pbVar41[lVar31 * 2];
              ppVar42 = ppVar32;
              if (CONCAT11(bVar36,pbVar13[lVar31 * 2 + 2]) != (png_ptr->trans_color).gray) {
                ppVar42 = (png_uint_16 *)
                          ((ulong)((uint)bVar36 + (uint)bVar36) +
                          (long)pppVar4[pbVar13[lVar31 * 2 + 2] >> (bVar11 & 0x1f)]);
              }
              *(png_uint_16 *)(pbVar41 + lVar31 * 2) = *ppVar42 << 8 | *ppVar42 >> 8;
            }
          }
        }
      }
      break;
    case '\x02':
      if (row_info->bit_depth == '\b') {
        if (ppVar23 == (png_bytep)0x0) {
          while( true ) {
            pbVar41 = pbVar13;
            pbVar13 = pbVar41 + 3;
            bVar49 = pVar12 == 0;
            pVar12 = pVar12 - 1;
            if (bVar49) break;
            if ((((png_ptr->trans_color).red == (ushort)pbVar41[1]) &&
                ((png_ptr->trans_color).green == (ushort)pbVar41[2])) &&
               ((png_ptr->trans_color).blue == (ushort)*pbVar13)) {
              pbVar41[1] = (byte)(png_ptr->background).red;
              pbVar41[2] = (byte)(png_ptr->background).green;
              *pbVar13 = (byte)(png_ptr->background).blue;
            }
          }
        }
        else {
          while( true ) {
            pbVar41 = pbVar13 + 3;
            bVar49 = pVar12 == 0;
            pVar12 = pVar12 - 1;
            if (bVar49) break;
            if ((((png_ptr->trans_color).red == (ushort)pbVar13[1]) &&
                ((png_ptr->trans_color).green == (ushort)pbVar13[2])) &&
               ((png_ptr->trans_color).blue == (ushort)*pbVar41)) {
              pbVar13[1] = (byte)(png_ptr->background).red;
              pbVar13[2] = (byte)(png_ptr->background).green;
              bVar11 = (byte)(png_ptr->background).blue;
            }
            else {
              pbVar13[1] = ppVar23[(ushort)pbVar13[1]];
              pbVar13[2] = ppVar23[pbVar13[2]];
              bVar11 = ppVar23[*pbVar41];
            }
            *pbVar41 = bVar11;
            pbVar13 = pbVar41;
          }
        }
      }
      else if (pppVar4 == (png_uint_16pp)0x0) {
        while( true ) {
          pbVar41 = pbVar13;
          pbVar13 = pbVar41 + 6;
          bVar49 = pVar12 == 0;
          pVar12 = pVar12 - 1;
          if (bVar49) break;
          if ((((ushort)(*(ushort *)(pbVar41 + 1) << 8 | *(ushort *)(pbVar41 + 1) >> 8) ==
                (png_ptr->trans_color).red) &&
              ((ushort)(*(ushort *)(pbVar41 + 3) << 8 | *(ushort *)(pbVar41 + 3) >> 8) ==
               (png_ptr->trans_color).green)) &&
             ((ushort)(*(ushort *)(pbVar41 + 5) << 8 | *(ushort *)(pbVar41 + 5) >> 8) ==
              (png_ptr->trans_color).blue)) {
            uVar24 = (png_ptr->background).red;
            *(ushort *)(pbVar41 + 1) = uVar24 << 8 | uVar24 >> 8;
            uVar24 = (png_ptr->background).green;
            *(ushort *)(pbVar41 + 3) = uVar24 << 8 | uVar24 >> 8;
            uVar24 = (png_ptr->background).blue;
            *(ushort *)(pbVar41 + 5) = uVar24 << 8 | uVar24 >> 8;
          }
        }
      }
      else {
        while( true ) {
          bVar49 = pVar12 == 0;
          pVar12 = pVar12 - 1;
          if (bVar49) break;
          bVar36 = pbVar13[6];
          if (((CONCAT11(pbVar13[1],pbVar13[2]) == (png_ptr->trans_color).red) &&
              (CONCAT11(pbVar13[3],pbVar13[4]) == (png_ptr->trans_color).green)) &&
             (CONCAT11(pbVar13[5],bVar36) == (png_ptr->trans_color).blue)) {
            uVar24 = (png_ptr->background).red;
            *(ushort *)(pbVar13 + 1) = uVar24 << 8 | uVar24 >> 8;
            uVar24 = (png_ptr->background).green;
            *(ushort *)(pbVar13 + 3) = uVar24 << 8 | uVar24 >> 8;
            ppVar32 = &(png_ptr->background).blue;
          }
          else {
            *(png_uint_16 *)(pbVar13 + 1) =
                 pppVar4[pbVar13[2] >> (bVar11 & 0x1f)][pbVar13[1]] << 8 |
                 pppVar4[pbVar13[2] >> (bVar11 & 0x1f)][pbVar13[1]] >> 8;
            *(png_uint_16 *)(pbVar13 + 3) =
                 pppVar4[pbVar13[4] >> (bVar11 & 0x1f)][pbVar13[3]] << 8 |
                 pppVar4[pbVar13[4] >> (bVar11 & 0x1f)][pbVar13[3]] >> 8;
            ppVar32 = (png_uint_16 *)
                      ((ulong)((uint)pbVar13[5] * 2) + (long)pppVar4[bVar36 >> (bVar11 & 0x1f)]);
          }
          *(png_uint_16 *)(pbVar13 + 5) = *ppVar32 << 8 | *ppVar32 >> 8;
          pbVar13 = pbVar13 + 6;
        }
      }
      break;
    case '\x04':
      if (row_info->bit_depth == '\b') {
        if ((ppVar14 == (png_bytep)0x0 || ppVar5 == (png_bytep)0x0) || ppVar23 == (png_bytep)0x0) {
          for (lVar31 = 0; pVar12 != (png_uint_32)lVar31; lVar31 = lVar31 + 1) {
            bVar11 = pbVar13[lVar31 * 2 + 2];
            if (bVar11 != 0xff) {
              if (bVar11 == 0) {
                bVar11 = (byte)(png_ptr->background).gray;
              }
              else {
                uVar37 = (uint)(ushort)((ushort)(byte)~bVar11 * (png_ptr->background).gray) +
                         (uint)pbVar13[lVar31 * 2 + 1] * (uint)bVar11 + 0x80 & 0xffff;
                bVar11 = (byte)((uVar37 >> 8) + uVar37 >> 8);
              }
              pbVar13[lVar31 * 2 + 1] = bVar11;
            }
          }
        }
        else {
          for (lVar31 = 0; pVar12 != (png_uint_32)lVar31; lVar31 = lVar31 + 1) {
            bVar11 = pbVar13[lVar31 * 2 + 2];
            if (bVar11 == 0) {
              bVar11 = (byte)(png_ptr->background).gray;
            }
            else if (bVar11 == 0xff) {
              bVar11 = ppVar23[pbVar41[lVar31 * 2]];
            }
            else {
              uVar18 = (uint)(ushort)((ushort)(byte)~bVar11 * (png_ptr->background_1).gray) +
                       (uint)ppVar5[pbVar41[lVar31 * 2]] * (uint)bVar11 + 0x80 & 0xffff;
              bVar11 = (byte)((uVar18 >> 8) + uVar18 >> 8);
              if ((uVar37 >> 0xd & 1) == 0) {
                bVar11 = ppVar14[bVar11];
              }
            }
            pbVar41[lVar31 * 2] = bVar11;
          }
        }
      }
      else if ((pppVar6 == (png_uint_16pp)0x0 || pppVar4 == (png_uint_16pp)0x0) ||
               pppVar7 == (png_uint_16pp)0x0) {
        for (lVar31 = 0; pVar12 != (png_uint_32)lVar31; lVar31 = lVar31 + 1) {
          uVar24 = *(ushort *)(pbVar13 + lVar31 * 4 + 3) << 8 |
                   *(ushort *)(pbVar13 + lVar31 * 4 + 3) >> 8;
          if (uVar24 != 0xffff) {
            if (uVar24 == 0) {
              pVar25 = (png_ptr->background).gray;
              pbVar41[lVar31 * 4] = (byte)(pVar25 >> 8);
              pbVar13[lVar31 * 4 + 2] = (byte)pVar25;
            }
            else {
              iVar46 = (((*(ushort *)(pbVar41 + lVar31 * 4) & 0xff00) << 8 |
                        (uint)*(ushort *)(pbVar41 + lVar31 * 4) << 0x18) >> 0x10) * (uint)uVar24;
              iVar40 = (uVar24 ^ 0xffff) * (uint)(png_ptr->background).gray;
              iVar40 = (iVar40 + iVar46 + 0x8000U >> 0x10) + iVar40 + iVar46 + 0x8000;
              pbVar41[lVar31 * 4] = (byte)((uint)iVar40 >> 0x18);
              pbVar13[lVar31 * 4 + 2] = (byte)((uint)iVar40 >> 0x10);
            }
          }
        }
      }
      else {
        for (lVar31 = 0; pVar12 != (png_uint_32)lVar31; lVar31 = lVar31 + 1) {
          uVar24 = *(ushort *)(pbVar13 + lVar31 * 4 + 3) << 8 |
                   *(ushort *)(pbVar13 + lVar31 * 4 + 3) >> 8;
          if (uVar24 == 0) {
            pVar25 = (png_ptr->background).gray;
LAB_00111e77:
            pbVar41[lVar31 * 4] = (byte)(pVar25 >> 8);
            pbVar13[lVar31 * 4 + 2] = (byte)pVar25;
          }
          else {
            if (uVar24 == 0xffff) {
              pVar25 = pppVar4[pbVar13[lVar31 * 4 + 2] >> (bVar11 & 0x1f)][pbVar41[lVar31 * 4]];
              goto LAB_00111e77;
            }
            iVar46 = (uint)pppVar7[pbVar13[lVar31 * 4 + 2] >> (bVar11 & 0x1f)][pbVar41[lVar31 * 4]]
                     * (uint)uVar24;
            iVar40 = (uVar24 ^ 0xffff) * (uint)(png_ptr->background_1).gray;
            uVar18 = (iVar46 + iVar40 + 0x8000U >> 0x10) + iVar46 + iVar40 + 0x8000;
            pVar25 = (png_uint_16)(uVar18 >> 0x10);
            if ((uVar37 >> 0xd & 1) == 0) {
              pVar25 = pppVar6[(uVar18 >> 0x10 & 0xff) >> (bVar11 & 0x1f)][uVar18 >> 0x18];
            }
            *(png_uint_16 *)(pbVar41 + lVar31 * 4) = pVar25 << 8 | pVar25 >> 8;
          }
        }
      }
      break;
    case '\x06':
      if (row_info->bit_depth == '\b') {
        if ((ppVar14 == (png_bytep)0x0 || ppVar5 == (png_bytep)0x0) || ppVar23 == (png_bytep)0x0) {
          for (lVar31 = 0; pVar12 != (png_uint_32)lVar31; lVar31 = lVar31 + 1) {
            bVar11 = pbVar13[lVar31 * 4 + 4];
            if (bVar11 != 0xff) {
              if (bVar11 == 0) {
                pbVar13[lVar31 * 4 + 1] = (byte)(png_ptr->background).red;
                pbVar13[lVar31 * 4 + 2] = (byte)(png_ptr->background).green;
                pbVar13[lVar31 * 4 + 3] = (byte)(png_ptr->background).blue;
              }
              else {
                bVar36 = ~bVar11;
                iVar40 = (uint)(png_ptr->background).red * (uint)bVar36 +
                         (uint)pbVar13[lVar31 * 4 + 1] * (uint)bVar11;
                pbVar13[lVar31 * 4 + 1] = (byte)((iVar40 + 0x80U >> 8 & 0xff) + iVar40 + 0x80 >> 8);
                iVar40 = (uint)(png_ptr->background).green * (uint)bVar36 +
                         (uint)pbVar13[lVar31 * 4 + 2] * (uint)bVar11;
                pbVar13[lVar31 * 4 + 2] = (byte)((iVar40 + 0x80U >> 8 & 0xff) + iVar40 + 0x80 >> 8);
                iVar40 = (uint)(png_ptr->background).blue * (uint)bVar36 +
                         (uint)pbVar13[lVar31 * 4 + 3] * (uint)bVar11;
                pbVar13[lVar31 * 4 + 3] = (byte)((iVar40 + 0x80U >> 8 & 0xff) + iVar40 + 0x80 >> 8);
              }
            }
          }
        }
        else {
          for (lVar31 = 0; pVar12 != (png_uint_32)lVar31; lVar31 = lVar31 + 1) {
            bVar11 = pbVar13[lVar31 * 4 + 4];
            if (bVar11 == 0) {
              pbVar41[lVar31 * 4] = (byte)(png_ptr->background).red;
              pbVar13[lVar31 * 4 + 2] = (byte)(png_ptr->background).green;
              bVar11 = (byte)(png_ptr->background).blue;
LAB_0011170d:
              pbVar13[lVar31 * 4 + 3] = bVar11;
            }
            else {
              uVar18 = (uint)bVar11;
              if (uVar18 == 0xff) {
                pbVar41[lVar31 * 4] = ppVar23[pbVar41[lVar31 * 4]];
                pbVar13[lVar31 * 4 + 2] = ppVar23[pbVar13[lVar31 * 4 + 2]];
                bVar11 = ppVar23[pbVar13[lVar31 * 4 + 3]];
                goto LAB_0011170d;
              }
              bVar38 = ~bVar11;
              iVar40 = (uint)(png_ptr->background_1).red * (uint)bVar38;
              bVar36 = (byte)((iVar40 + ppVar5[pbVar41[lVar31 * 4]] * uVar18 + 0x80 >> 8 & 0xff) +
                              ppVar5[pbVar41[lVar31 * 4]] * uVar18 + iVar40 + 0x80 >> 8);
              if ((uVar37 >> 0xd & 1) == 0) {
                bVar36 = ppVar14[bVar36];
              }
              pbVar41[lVar31 * 4] = bVar36;
              iVar40 = (uint)(png_ptr->background_1).green * (uint)bVar38;
              bVar36 = (byte)((iVar40 + ppVar5[pbVar13[lVar31 * 4 + 2]] * uVar18 + 0x80 >> 8 & 0xff)
                              + ppVar5[pbVar13[lVar31 * 4 + 2]] * uVar18 + iVar40 + 0x80 >> 8);
              if ((uVar37 >> 0xd & 1) == 0) {
                bVar36 = ppVar14[bVar36];
              }
              pbVar13[lVar31 * 4 + 2] = bVar36;
              iVar40 = (uint)(png_ptr->background_1).blue * (uint)bVar38;
              bVar11 = (byte)(((uint)ppVar5[pbVar13[lVar31 * 4 + 3]] * (uint)bVar11 + iVar40 + 0x80
                               >> 8 & 0xff) +
                              (uint)ppVar5[pbVar13[lVar31 * 4 + 3]] * (uint)bVar11 + iVar40 + 0x80
                             >> 8);
              if ((uVar37 >> 0xd & 1) == 0) {
                bVar11 = ppVar14[bVar11];
              }
              pbVar13[lVar31 * 4 + 3] = bVar11;
            }
          }
        }
      }
      else if ((pppVar6 == (png_uint_16pp)0x0 || pppVar4 == (png_uint_16pp)0x0) ||
               pppVar7 == (png_uint_16pp)0x0) {
        for (lVar31 = 0; pVar12 != (png_uint_32)lVar31; lVar31 = lVar31 + 1) {
          uVar24 = *(ushort *)(pbVar13 + lVar31 * 8 + 7) << 8 |
                   *(ushort *)(pbVar13 + lVar31 * 8 + 7) >> 8;
          if (uVar24 != 0xffff) {
            if (uVar24 == 0) {
              pVar25 = (png_ptr->background).red;
              pbVar41[lVar31 * 8] = (byte)(pVar25 >> 8);
              pbVar13[lVar31 * 8 + 2] = (byte)pVar25;
              uVar24 = (png_ptr->background).green;
              *(ushort *)(pbVar13 + lVar31 * 8 + 3) = uVar24 << 8 | uVar24 >> 8;
              uVar24 = (png_ptr->background).blue;
              *(ushort *)(pbVar13 + lVar31 * 8 + 5) = uVar24 << 8 | uVar24 >> 8;
            }
            else {
              uVar28 = *(ushort *)(pbVar13 + lVar31 * 8 + 3);
              uVar29 = *(ushort *)(pbVar13 + lVar31 * 8 + 5);
              uVar37 = (uint)uVar24;
              uVar18 = uVar37 ^ 0xffff;
              iVar40 = (png_ptr->background).red * uVar18 +
                       (((*(ushort *)(pbVar41 + lVar31 * 8) & 0xff00) << 8 |
                        (uint)*(ushort *)(pbVar41 + lVar31 * 8) << 0x18) >> 0x10) * uVar37;
              iVar40 = (iVar40 + 0x8000U >> 0x10) + iVar40 + 0x8000;
              pbVar41[lVar31 * 8] = (byte)((uint)iVar40 >> 0x18);
              pbVar13[lVar31 * 8 + 2] = (byte)((uint)iVar40 >> 0x10);
              iVar40 = (png_ptr->background).green * uVar18 +
                       (ushort)(uVar28 << 8 | uVar28 >> 8) * uVar37;
              iVar40 = (iVar40 + 0x8000U >> 0x10) + iVar40 + 0x8000;
              pbVar13[lVar31 * 8 + 3] = (byte)((uint)iVar40 >> 0x18);
              pbVar13[lVar31 * 8 + 4] = (byte)((uint)iVar40 >> 0x10);
              iVar40 = (png_ptr->background).blue * uVar18 +
                       (ushort)(uVar29 << 8 | uVar29 >> 8) * uVar37;
              iVar40 = iVar40 + (iVar40 + 0x8000U >> 0x10) + 0x8000;
              pbVar13[lVar31 * 8 + 5] = (byte)((uint)iVar40 >> 0x18);
              pbVar13[lVar31 * 8 + 6] = (byte)((uint)iVar40 >> 0x10);
            }
          }
        }
      }
      else {
        for (lVar31 = 0; pVar12 != (png_uint_32)lVar31; lVar31 = lVar31 + 1) {
          uVar24 = *(ushort *)(pbVar13 + lVar31 * 8 + 7) << 8 |
                   *(ushort *)(pbVar13 + lVar31 * 8 + 7) >> 8;
          if (uVar24 == 0) {
            pVar25 = (png_ptr->background).red;
            pbVar41[lVar31 * 8] = (byte)(pVar25 >> 8);
            pbVar13[lVar31 * 8 + 2] = (byte)pVar25;
            uVar24 = (png_ptr->background).green;
            *(ushort *)(pbVar13 + lVar31 * 8 + 3) = uVar24 << 8 | uVar24 >> 8;
            pVar25 = (png_ptr->background).blue;
LAB_0011214c:
            *(png_uint_16 *)(pbVar13 + lVar31 * 8 + 5) = pVar25 << 8 | pVar25 >> 8;
          }
          else {
            if (uVar24 == 0xffff) {
              pVar25 = pppVar4[pbVar13[lVar31 * 8 + 2] >> (bVar11 & 0x1f)][pbVar41[lVar31 * 8]];
              pbVar41[lVar31 * 8] = (byte)(pVar25 >> 8);
              pbVar13[lVar31 * 8 + 2] = (byte)pVar25;
              *(png_uint_16 *)(pbVar13 + lVar31 * 8 + 3) =
                   pppVar4[pbVar13[lVar31 * 8 + 4] >> (bVar11 & 0x1f)][pbVar13[lVar31 * 8 + 3]] << 8
                   | pppVar4[pbVar13[lVar31 * 8 + 4] >> (bVar11 & 0x1f)][pbVar13[lVar31 * 8 + 3]] >>
                     8;
              pVar25 = pppVar4[pbVar13[lVar31 * 8 + 6] >> (bVar11 & 0x1f)][pbVar13[lVar31 * 8 + 5]];
              goto LAB_0011214c;
            }
            iVar40 = (uint)pppVar7[pbVar13[lVar31 * 8 + 2] >> (bVar11 & 0x1f)][pbVar41[lVar31 * 8]]
                     * (uint)uVar24;
            uVar26 = (uint)uVar24;
            uVar45 = uVar26 ^ 0xffff;
            iVar46 = (png_ptr->background_1).red * uVar45;
            uVar18 = iVar40 + iVar46 + (iVar40 + iVar46 + 0x8000U >> 0x10) + 0x8000;
            pVar25 = (png_uint_16)(uVar18 >> 0x10);
            if ((uVar37 >> 0xd & 1) == 0) {
              pVar25 = pppVar6[(uVar18 >> 0x10 & 0xff) >> (bVar11 & 0x1f)][uVar18 >> 0x18];
            }
            *(png_uint_16 *)(pbVar41 + lVar31 * 8) = pVar25 << 8 | pVar25 >> 8;
            iVar40 = (png_ptr->background_1).green * uVar45;
            uVar18 = pppVar7[pbVar13[lVar31 * 8 + 4] >> (bVar11 & 0x1f)][pbVar13[lVar31 * 8 + 3]] *
                     uVar26 + iVar40 +
                     (pppVar7[pbVar13[lVar31 * 8 + 4] >> (bVar11 & 0x1f)][pbVar13[lVar31 * 8 + 3]] *
                      uVar26 + iVar40 + 0x8000 >> 0x10) + 0x8000;
            pVar25 = (png_uint_16)(uVar18 >> 0x10);
            if ((uVar37 >> 0xd & 1) == 0) {
              pVar25 = pppVar6[(uVar18 >> 0x10 & 0xff) >> (bVar11 & 0x1f)][uVar18 >> 0x18];
            }
            *(png_uint_16 *)(pbVar13 + lVar31 * 8 + 3) = pVar25 << 8 | pVar25 >> 8;
            iVar40 = uVar45 * (png_ptr->background_1).blue;
            uVar18 = (uVar26 * pppVar7[pbVar13[lVar31 * 8 + 6] >> (bVar11 & 0x1f)]
                               [pbVar13[lVar31 * 8 + 5]] + iVar40 + 0x8000 >> 0x10) +
                     uVar26 * pppVar7[pbVar13[lVar31 * 8 + 6] >> (bVar11 & 0x1f)]
                              [pbVar13[lVar31 * 8 + 5]] + iVar40 + 0x8000;
            pVar25 = (png_uint_16)(uVar18 >> 0x10);
            if ((uVar37 >> 0xd & 1) == 0) {
              pVar25 = pppVar6[(uVar18 >> 0x10 & 0xff) >> (bVar11 & 0x1f)][uVar18 >> 0x18];
            }
            *(png_uint_16 *)(pbVar13 + lVar31 * 8 + 5) = pVar25 << 8 | pVar25 >> 8;
          }
        }
      }
    }
  }
  if ((png_ptr->transformations & 0x602000) == 0x2000) {
    if ((char)png_ptr->transformations < '\0') {
      if ((png_ptr->num_trans != 0) || (bVar11 = png_ptr->color_type, (bVar11 & 4) != 0))
      goto switchD_0011125f_caseD_1;
    }
    else {
      bVar11 = png_ptr->color_type;
    }
    if (bVar11 != 3) {
      pbVar41 = png_ptr->row_buf;
      ppVar23 = png_ptr->gamma_table;
      pppVar4 = png_ptr->gamma_16_table;
      uVar37 = row_info->width;
      bVar11 = row_info->bit_depth;
      if (((bVar11 < 9 && ppVar23 != (png_bytep)0x0) ||
          (pppVar4 != (png_uint_16pp)0x0 && bVar11 == 0x10)) && (row_info->color_type < 7)) {
        pbVar13 = pbVar41 + 1;
        bVar36 = (byte)png_ptr->gamma_shift;
        switch(row_info->color_type) {
        case '\0':
          if (bVar11 == 2) {
            pbVar21 = pbVar13;
            for (uVar18 = 0; uVar18 < uVar37; uVar18 = uVar18 + 4) {
              bVar11 = *pbVar21;
              uVar45 = bVar11 & 0xffffffc0;
              uVar26 = bVar11 & 0x30;
              uVar47 = bVar11 & 0xc;
              *pbVar21 = ppVar23[(ulong)(bVar11 & 3) * 0x55] >> 6 |
                         ppVar23[uVar47 >> 2 | uVar47 * 0x14 | uVar47] >> 4 & 0xc |
                         ppVar23[uVar26 >> 4 | (uVar26 >> 2) + uVar26 * 4 | uVar26] >> 2 & 0x30 |
                         ppVar23[(uint)(bVar11 >> 6) | uVar45 >> 4 | uVar45 >> 2 | uVar45] & 0xc0;
              pbVar21 = pbVar21 + 1;
            }
            bVar11 = row_info->bit_depth;
          }
          if (bVar11 == 4) {
            for (uVar18 = 0; uVar18 < uVar37; uVar18 = uVar18 + 2) {
              bVar11 = *pbVar13;
              *pbVar13 = ppVar23[(ulong)(bVar11 & 0xf) * 0x11] >> 4 |
                         ppVar23[(ulong)(bVar11 >> 4) | (ulong)(bVar11 & 0xfffffff0)] & 0xf0;
              pbVar13 = pbVar13 + 1;
            }
          }
          else if (bVar11 == 8) {
            for (lVar31 = 0; uVar37 != (uint)lVar31; lVar31 = lVar31 + 1) {
              pbVar13[lVar31] = ppVar23[pbVar13[lVar31]];
            }
          }
          else if (bVar11 == 0x10) {
            for (lVar31 = 0; uVar37 != (uint)lVar31; lVar31 = lVar31 + 1) {
              *(png_uint_16 *)(pbVar41 + lVar31 * 2 + 1) =
                   pppVar4[pbVar41[lVar31 * 2 + 2] >> (bVar36 & 0x1f)][pbVar41[lVar31 * 2 + 1]] << 8
                   | pppVar4[pbVar41[lVar31 * 2 + 2] >> (bVar36 & 0x1f)][pbVar41[lVar31 * 2 + 1]] >>
                     8;
            }
          }
          break;
        case '\x02':
          if (bVar11 == 8) {
            while (bVar49 = uVar37 != 0, uVar37 = uVar37 - 1, bVar49) {
              *pbVar13 = ppVar23[*pbVar13];
              pbVar13[1] = ppVar23[pbVar13[1]];
              pbVar13[2] = ppVar23[pbVar13[2]];
              pbVar13 = pbVar13 + 3;
            }
          }
          else {
            while( true ) {
              bVar49 = uVar37 == 0;
              uVar37 = uVar37 - 1;
              if (bVar49) break;
              *(png_uint_16 *)(pbVar41 + 1) =
                   pppVar4[pbVar41[2] >> (bVar36 & 0x1f)][pbVar41[1]] << 8 |
                   pppVar4[pbVar41[2] >> (bVar36 & 0x1f)][pbVar41[1]] >> 8;
              *(png_uint_16 *)(pbVar41 + 3) =
                   pppVar4[pbVar41[4] >> (bVar36 & 0x1f)][pbVar41[3]] << 8 |
                   pppVar4[pbVar41[4] >> (bVar36 & 0x1f)][pbVar41[3]] >> 8;
              *(png_uint_16 *)(pbVar41 + 5) =
                   pppVar4[pbVar41[6] >> (bVar36 & 0x1f)][pbVar41[5]] << 8 |
                   pppVar4[pbVar41[6] >> (bVar36 & 0x1f)][pbVar41[5]] >> 8;
              pbVar41 = pbVar41 + 6;
            }
          }
          break;
        case '\x04':
          if (bVar11 == 8) {
            for (lVar31 = 0; uVar37 != (uint)lVar31; lVar31 = lVar31 + 1) {
              pbVar13[lVar31 * 2] = ppVar23[pbVar13[lVar31 * 2]];
            }
          }
          else {
            for (lVar31 = 0; uVar37 != (uint)lVar31; lVar31 = lVar31 + 1) {
              *(png_uint_16 *)(pbVar41 + lVar31 * 4 + 1) =
                   pppVar4[pbVar41[lVar31 * 4 + 2] >> (bVar36 & 0x1f)][pbVar41[lVar31 * 4 + 1]] << 8
                   | pppVar4[pbVar41[lVar31 * 4 + 2] >> (bVar36 & 0x1f)][pbVar41[lVar31 * 4 + 1]] >>
                     8;
            }
          }
          break;
        case '\x06':
          if (bVar11 == 8) {
            for (lVar31 = 0; uVar37 != (uint)lVar31; lVar31 = lVar31 + 1) {
              pbVar13[lVar31 * 4] = ppVar23[pbVar13[lVar31 * 4]];
              pbVar41[lVar31 * 4 + 2] = ppVar23[pbVar41[lVar31 * 4 + 2]];
              pbVar41[lVar31 * 4 + 3] = ppVar23[pbVar41[lVar31 * 4 + 3]];
            }
          }
          else {
            for (lVar31 = 0; uVar37 != (uint)lVar31; lVar31 = lVar31 + 1) {
              *(png_uint_16 *)(pbVar41 + lVar31 * 8 + 1) =
                   pppVar4[pbVar41[lVar31 * 8 + 2] >> (bVar36 & 0x1f)][pbVar41[lVar31 * 8 + 1]] << 8
                   | pppVar4[pbVar41[lVar31 * 8 + 2] >> (bVar36 & 0x1f)][pbVar41[lVar31 * 8 + 1]] >>
                     8;
              *(png_uint_16 *)(pbVar41 + lVar31 * 8 + 3) =
                   pppVar4[pbVar41[lVar31 * 8 + 4] >> (bVar36 & 0x1f)][pbVar41[lVar31 * 8 + 3]] << 8
                   | pppVar4[pbVar41[lVar31 * 8 + 4] >> (bVar36 & 0x1f)][pbVar41[lVar31 * 8 + 3]] >>
                     8;
              *(png_uint_16 *)(pbVar41 + lVar31 * 8 + 5) =
                   pppVar4[pbVar41[lVar31 * 8 + 6] >> (bVar36 & 0x1f)][pbVar41[lVar31 * 8 + 5]] << 8
                   | pppVar4[pbVar41[lVar31 * 8 + 6] >> (bVar36 & 0x1f)][pbVar41[lVar31 * 8 + 5]] >>
                     8;
            }
          }
        }
      }
    }
  }
switchD_0011125f_caseD_1:
  uVar37 = png_ptr->transformations;
  if (((~uVar37 & 0x40080) == 0) && ((row_info->color_type | 2) == 6)) {
    png_do_strip_channel(row_info,png_ptr->row_buf + 1,0);
    uVar37 = png_ptr->transformations;
  }
  if (((uVar37 >> 0x17 & 1) != 0) && (bVar11 = row_info->color_type, (bVar11 & 4) != 0)) {
    pVar12 = row_info->width;
    if (row_info->bit_depth == '\x10') {
      pppVar4 = png_ptr->gamma_16_from_1;
      if (pppVar4 == (png_uint_16pp)0x0) goto LAB_0011196e;
      iVar40 = png_ptr->gamma_shift;
      uVar19 = (ulong)(bVar11 & 2);
      pbVar41 = png_ptr->row_buf + uVar19 * 2 + 4;
      while (bVar49 = pVar12 != 0, pVar12 = pVar12 - 1, bVar49) {
        uVar24 = pppVar4[*pbVar41 >> ((byte)iVar40 & 0x1f)][pbVar41[-1]];
        *(ushort *)(pbVar41 + -1) = uVar24 << 8 | uVar24 >> 8;
        pbVar41 = pbVar41 + uVar19 * 2 + 4;
      }
    }
    else if ((row_info->bit_depth == '\b') &&
            (ppVar23 = png_ptr->gamma_from_1, ppVar23 != (png_bytep)0x0)) {
      uVar19 = (ulong)(bVar11 & 2);
      pbVar41 = png_ptr->row_buf + uVar19 + 2;
      while (bVar49 = pVar12 != 0, pVar12 = pVar12 - 1, bVar49) {
        *pbVar41 = ppVar23[*pbVar41];
        pbVar41 = pbVar41 + uVar19 + 2;
      }
    }
    else {
LAB_0011196e:
      png_warning(png_ptr,"png_do_encode_alpha: unexpected call");
    }
  }
  uVar37 = png_ptr->transformations;
  if (((uVar37 >> 0x1a & 1) != 0) && (row_info->bit_depth == '\x10')) {
    pbVar13 = png_ptr->row_buf + 1;
    pbVar21 = pbVar13 + row_info->rowbytes;
    for (pbVar41 = pbVar13; pbVar41 < pbVar21; pbVar41 = pbVar41 + 2) {
      *pbVar13 = (char)(((uint)pbVar41[1] - (uint)*pbVar41) * 0xffff + 0x7fff80 >> 0x18) + *pbVar41;
      pbVar13 = pbVar13 + 1;
    }
    row_info->bit_depth = '\b';
    row_info->pixel_depth = row_info->channels * '\b';
    row_info->rowbytes = (ulong)((uint)row_info->channels * row_info->width);
    uVar37 = png_ptr->transformations;
  }
  if (((uVar37 >> 10 & 1) != 0) && (row_info->bit_depth == '\x10')) {
    ppVar14 = png_ptr->row_buf + 1;
    ppVar22 = ppVar14 + row_info->rowbytes;
    for (ppVar23 = ppVar14; ppVar23 < ppVar22; ppVar23 = ppVar23 + 2) {
      *ppVar14 = *ppVar23;
      ppVar14 = ppVar14 + 1;
    }
    row_info->bit_depth = '\b';
    row_info->pixel_depth = row_info->channels * '\b';
    row_info->rowbytes = (ulong)((uint)row_info->channels * row_info->width);
    uVar37 = png_ptr->transformations;
  }
  if ((uVar37 & 0x40) != 0) {
    if (row_info->bit_depth == '\b') {
      ppVar23 = png_ptr->row_buf;
      ppVar14 = png_ptr->palette_lookup;
      uVar37 = row_info->width;
      pVar15 = row_info->color_type;
      if (ppVar14 == (png_bytep)0x0 || pVar15 != '\x02') {
        if (pVar15 != '\x06' || ppVar14 == (png_bytep)0x0) {
          ppVar14 = png_ptr->quantize_index;
          if (ppVar14 != (png_bytep)0x0 && pVar15 == '\x03') {
            for (lVar31 = 0; uVar37 != (uint)lVar31; lVar31 = lVar31 + 1) {
              ppVar23[lVar31 + 1] = ppVar14[ppVar23[lVar31 + 1]];
            }
          }
          goto LAB_00111b65;
        }
        for (lVar31 = 0; uVar37 != (uint)lVar31; lVar31 = lVar31 + 1) {
          ppVar23[lVar31 + 1] =
               ppVar14[(uint)(ppVar23[lVar31 * 4 + 3] >> 3) |
                       (ppVar23[lVar31 * 4 + 1] & 0xf8) * 0x80 +
                       (ppVar23[lVar31 * 4 + 2] & 0xfffffff8) * 4];
        }
      }
      else {
        lVar31 = 0;
        for (lVar35 = 0; uVar37 != (uint)lVar35; lVar35 = lVar35 + 1) {
          ppVar23[lVar35 + 1] =
               ppVar14[(uint)(ppVar23[lVar31 + 3] >> 3) |
                       (ppVar23[lVar31 + 1] & 0xf8) * 0x80 + (ppVar23[lVar31 + 2] & 0xfffffff8) * 4]
          ;
          lVar31 = lVar31 + 3;
        }
      }
      row_info->color_type = '\x03';
      row_info->channels = '\x01';
      bVar11 = row_info->bit_depth;
      row_info->pixel_depth = bVar11;
      if ((ulong)bVar11 < 8) {
        uVar19 = (ulong)bVar11 * (ulong)uVar37 + 7 >> 3;
      }
      else {
        uVar19 = (ulong)(bVar11 >> 3) * (ulong)uVar37;
      }
      row_info->rowbytes = uVar19;
    }
LAB_00111b65:
    if (row_info->rowbytes == 0) {
      error_message = "png_do_quantize returned rowbytes=0";
LAB_0011314c:
      png_error(png_ptr,error_message);
    }
    uVar37 = png_ptr->transformations;
  }
  if ((((uVar37 >> 9 & 1) != 0) && (row_info->bit_depth == '\b')) &&
     (row_info->color_type != '\x03')) {
    ppVar23 = png_ptr->row_buf + row_info->rowbytes + 1;
    ppVar14 = ppVar23 + row_info->rowbytes;
    for (; ppVar23 < ppVar14; ppVar23 = ppVar23 + -1) {
      pVar15 = ppVar23[-1];
      ppVar14[-1] = pVar15;
      ppVar14[-2] = pVar15;
      ppVar14 = ppVar14 + -2;
    }
    row_info->rowbytes = row_info->rowbytes << 1;
    row_info->bit_depth = '\x10';
    row_info->pixel_depth = row_info->channels << 4;
    uVar37 = png_ptr->transformations;
  }
  if (((uVar37 >> 0xe & 1) != 0) && ((png_ptr->mode & 0x800) != 0)) {
    png_do_gray_to_rgb(row_info,png_ptr->row_buf + 1);
    uVar37 = png_ptr->transformations;
  }
  if ((uVar37 & 0x20) != 0) {
    png_do_invert(row_info,png_ptr->row_buf + 1);
    uVar37 = png_ptr->transformations;
  }
  if ((uVar37 >> 0x13 & 1) != 0) {
    ppVar23 = png_ptr->row_buf;
    pVar12 = row_info->width;
    if (row_info->color_type == '\x04') {
      sVar8 = row_info->rowbytes;
      if (row_info->bit_depth == '\b') {
        for (lVar31 = 0; -pVar12 != (int)lVar31; lVar31 = lVar31 + -1) {
          ppVar23[lVar31 * 2 + sVar8] = ~ppVar23[lVar31 * 2 + sVar8];
        }
      }
      else {
        for (lVar31 = 0; -pVar12 != (int)lVar31; lVar31 = lVar31 + -1) {
          ppVar23[lVar31 * 4 + sVar8] = ~ppVar23[lVar31 * 4 + sVar8];
          ppVar23[lVar31 * 4 + (sVar8 - 1)] = ~ppVar23[lVar31 * 4 + (sVar8 - 1)];
        }
      }
    }
    else if (row_info->color_type == '\x06') {
      sVar8 = row_info->rowbytes;
      if (row_info->bit_depth == '\b') {
        for (lVar31 = 0; -pVar12 != (int)lVar31; lVar31 = lVar31 + -1) {
          ppVar23[lVar31 * 4 + sVar8] = ~ppVar23[lVar31 * 4 + sVar8];
        }
      }
      else {
        for (lVar31 = 0; -pVar12 != (int)lVar31; lVar31 = lVar31 + -1) {
          ppVar23[lVar31 * 8 + sVar8] = ~ppVar23[lVar31 * 8 + sVar8];
          ppVar23[lVar31 * 8 + (sVar8 - 1)] = ~ppVar23[lVar31 * 8 + (sVar8 - 1)];
        }
      }
    }
  }
  uVar37 = png_ptr->transformations;
  if (((uVar37 & 8) != 0) && (bVar11 = row_info->color_type, bVar11 != 3)) {
    bVar36 = row_info->bit_depth;
    if ((bVar11 & 2) == 0) {
      bVar38 = (png_ptr->shift).gray;
      uVar18 = 1;
    }
    else {
      uVar18 = 3;
      bVar38 = (png_ptr->shift).red;
      local_58[1] = (uint)bVar36 - (uint)(png_ptr->shift).green;
      local_58[2] = (uint)bVar36 - (uint)(png_ptr->shift).blue;
    }
    ppVar23 = png_ptr->row_buf;
    uVar26 = (uint)bVar36;
    local_58[0] = uVar26 - bVar38;
    if ((bVar11 & 4) != 0) {
      uVar19 = (ulong)uVar18;
      uVar18 = uVar18 + 1;
      local_58[uVar19] = uVar26 - (png_ptr->shift).alpha;
    }
    puVar30 = (ushort *)(ppVar23 + 1);
    bVar49 = false;
    for (uVar19 = 0; uVar18 != uVar19; uVar19 = uVar19 + 1) {
      iVar40 = local_58[uVar19];
      bVar10 = iVar40 < 1;
      bVar9 = (int)uVar26 <= iVar40;
      if (bVar10 || bVar9) {
        iVar40 = 0;
      }
      local_58[uVar19] = iVar40;
      if (!bVar10 && !bVar9) {
        bVar49 = true;
      }
    }
    if (bVar49) {
      switch(bVar36 - 2 >> 1 | (uint)((bVar36 - 2 & 1) != 0) << 0x1f) {
      case 0:
        puVar48 = (ushort *)(row_info->rowbytes + (long)puVar30);
        for (; puVar30 < puVar48; puVar30 = (ushort *)((long)puVar30 + 1)) {
          *(byte *)puVar30 = (byte)*puVar30 >> 1 & 0x55;
        }
        break;
      case 1:
        puVar48 = (ushort *)(row_info->rowbytes + (long)puVar30);
        for (; puVar30 < puVar48; puVar30 = (ushort *)((long)puVar30 + 1)) {
          *(byte *)puVar30 =
               (byte)*puVar30 >> ((byte)local_58[0] & 0x1f) &
               (char)(0xf >> ((byte)local_58[0] & 0x1f)) * '\x11';
        }
        break;
      case 3:
        puVar48 = (ushort *)(row_info->rowbytes + (long)puVar30);
        iVar40 = 0;
        for (; puVar30 < puVar48; puVar30 = (ushort *)((long)puVar30 + 1)) {
          lVar31 = (long)iVar40;
          iVar40 = iVar40 + 1;
          if ((int)uVar18 <= iVar40) {
            iVar40 = 0;
          }
          *(byte *)puVar30 = (byte)*puVar30 >> (*(byte *)(local_58 + lVar31) & 0x1f);
        }
        break;
      case 7:
        puVar48 = (ushort *)(row_info->rowbytes + (long)puVar30);
        iVar40 = 0;
        for (; puVar30 < puVar48; puVar30 = puVar30 + 1) {
          uVar24 = (ushort)(*puVar30 << 8 | *puVar30 >> 8) >> (*(byte *)(local_58 + iVar40) & 0x1f);
          iVar40 = iVar40 + 1;
          if ((int)uVar18 <= iVar40) {
            iVar40 = 0;
          }
          *puVar30 = uVar24 << 8 | uVar24 >> 8;
        }
      }
      uVar37 = png_ptr->transformations;
    }
  }
  if (((uVar37 & 4) != 0) && (bVar11 = row_info->bit_depth, bVar11 < 8)) {
    ppVar23 = png_ptr->row_buf;
    uVar37 = row_info->width;
    uVar19 = (ulong)uVar37;
    if (bVar11 == 4) {
      pbVar41 = ppVar23 + (ulong)(uVar37 - 1 >> 1) + 1;
      uVar18 = uVar37 * 4 & 4;
      for (; (int)uVar19 != 0; uVar19 = uVar19 - 1) {
        ppVar23[uVar19] = *pbVar41 >> (sbyte)uVar18 & 0xf;
        pbVar41 = pbVar41 + -(ulong)(uVar18 != 0);
        uVar18 = (uint)(uVar18 == 0) << 2;
      }
    }
    else if (bVar11 == 2) {
      pbVar41 = ppVar23 + (ulong)(uVar37 - 1 >> 2) + 1;
      uVar18 = ~(uVar37 * 2 + 6) & 6;
      for (; (int)uVar19 != 0; uVar19 = uVar19 - 1) {
        ppVar23[uVar19] = *pbVar41 >> ((byte)uVar18 & 0x1f) & 3;
        bVar49 = uVar18 == 6;
        uVar18 = uVar18 + 2;
        if (bVar49) {
          uVar18 = 0;
        }
        pbVar41 = pbVar41 + -(ulong)bVar49;
      }
    }
    else if (bVar11 == 1) {
      pbVar41 = ppVar23 + (ulong)(uVar37 - 1 >> 3) + 1;
      uVar18 = -uVar37 & 7;
      for (; (int)uVar19 != 0; uVar19 = uVar19 - 1) {
        ppVar23[uVar19] = (*pbVar41 >> (uVar18 & 0x1f) & 1) != 0;
        bVar49 = uVar18 == 7;
        uVar18 = uVar18 + 1;
        if (bVar49) {
          uVar18 = 0;
        }
        pbVar41 = pbVar41 + -(ulong)bVar49;
      }
    }
    row_info->bit_depth = '\b';
    row_info->pixel_depth = row_info->channels * '\b';
    row_info->rowbytes = (ulong)(row_info->channels * uVar37);
  }
  if ((row_info->color_type == '\x03') && (-1 < png_ptr->num_palette_max)) {
    png_do_check_palette_indexes(png_ptr,row_info);
  }
  uVar37 = png_ptr->transformations;
  if ((uVar37 & 1) != 0) {
    png_do_bgr(row_info,png_ptr->row_buf + 1);
    uVar37 = png_ptr->transformations;
  }
  if ((uVar37 >> 0x10 & 1) != 0) {
    png_do_packswap(row_info,png_ptr->row_buf + 1);
    uVar37 = png_ptr->transformations;
  }
  if ((short)uVar37 < 0) {
    ppVar23 = png_ptr->row_buf;
    uVar18 = row_info->width;
    uVar19 = (ulong)uVar18;
    sVar16 = 2;
    pVar15 = (png_byte)png_ptr->filler;
    cVar39 = (char)png_ptr->flags;
    pVar34 = (png_byte)(png_ptr->filler >> 8);
    if (row_info->color_type == '\x02') {
      if (row_info->bit_depth == '\x10') {
        ppVar22 = ppVar23 + uVar19 * 6;
        if (cVar39 < '\0') {
          ppVar33 = ppVar23 + uVar19 * 8;
          uVar37 = 1;
          while( true ) {
            *ppVar33 = pVar15;
            ppVar33[-1] = pVar34;
            if (uVar18 <= uVar37) break;
            ppVar33[-2] = *ppVar22;
            ppVar33[-3] = ppVar22[-1];
            ppVar33[-4] = ppVar22[-2];
            ppVar33[-5] = ppVar22[-3];
            ppVar33[-6] = ppVar22[-4];
            ppVar33[-7] = ppVar22[-5];
            uVar37 = uVar37 + 1;
            ppVar22 = ppVar22 + -6;
            ppVar33 = ppVar33 + -8;
          }
        }
        else {
          for (; (int)uVar19 != 0; uVar19 = uVar19 - 1) {
            ppVar23[uVar19 * 8] = *ppVar22;
            ppVar23[uVar19 * 8 + -1] = ppVar22[-1];
            ppVar23[uVar19 * 8 + -2] = ppVar22[-2];
            ppVar23[uVar19 * 8 + -3] = ppVar22[-3];
            ppVar23[uVar19 * 8 + -4] = ppVar22[-4];
            ppVar23[uVar19 * 8 + -5] = ppVar22[-5];
            ppVar23[uVar19 * 8 + -6] = pVar15;
            ppVar23[uVar19 * 8 + -7] = pVar34;
            ppVar22 = ppVar22 + -6;
          }
        }
        sVar16 = 3;
        pVar15 = '@';
      }
      else {
        if (row_info->bit_depth != '\b') goto LAB_00112771;
        ppVar22 = ppVar23 + uVar19 * 3;
        if (cVar39 < '\0') {
          ppVar33 = ppVar23 + uVar19 * 4;
          for (uVar37 = 1; *ppVar33 = pVar15, uVar37 < uVar18; uVar37 = uVar37 + 1) {
            ppVar33[-1] = *ppVar22;
            ppVar33[-2] = ppVar22[-1];
            ppVar33[-3] = ppVar22[-2];
            ppVar22 = ppVar22 + -3;
            ppVar33 = ppVar33 + -4;
          }
        }
        else {
          for (; (int)uVar19 != 0; uVar19 = uVar19 - 1) {
            ppVar23[uVar19 * 4] = *ppVar22;
            ppVar23[uVar19 * 4 + -1] = ppVar22[-1];
            ppVar23[uVar19 * 4 + -2] = ppVar22[-2];
            ppVar23[uVar19 * 4 + -3] = pVar15;
            ppVar22 = ppVar22 + -3;
          }
        }
        pVar15 = ' ';
      }
      pVar34 = '\x04';
    }
    else {
      if (row_info->color_type != '\0') goto LAB_00112771;
      if (row_info->bit_depth == '\x10') {
        if (cVar39 < '\0') {
          lVar31 = uVar19 * 2;
          uVar37 = 1;
          while( true ) {
            ppVar23[lVar31 * 2] = pVar15;
            ppVar23[lVar31 * 2 + -1] = pVar34;
            if (uVar18 <= uVar37) break;
            ppVar23[lVar31 * 2 + -2] = ppVar23[lVar31];
            ppVar23[lVar31 * 2 + -3] = ppVar23[lVar31 + -1];
            uVar37 = uVar37 + 1;
            lVar31 = lVar31 + -2;
          }
        }
        else {
          for (; (int)uVar19 != 0; uVar19 = uVar19 - 1) {
            ppVar23[uVar19 * 4] = ppVar23[uVar19 * 2];
            ppVar23[uVar19 * 4 + -1] = ppVar23[uVar19 * 2 + -1];
            ppVar23[uVar19 * 4 + -2] = pVar15;
            ppVar23[uVar19 * 4 + -3] = pVar34;
          }
        }
        pVar15 = ' ';
        sVar16 = 2;
      }
      else {
        if (row_info->bit_depth != '\b') goto LAB_00112771;
        if (cVar39 < '\0') {
          for (uVar37 = 1; ppVar23[uVar19 * 2] = pVar15, uVar37 < uVar18; uVar37 = uVar37 + 1) {
            ppVar23[uVar19 * 2 + -1] = ppVar23[uVar19];
            uVar19 = uVar19 - 1;
          }
        }
        else {
          for (; (int)uVar19 != 0; uVar19 = uVar19 - 1) {
            ppVar23[uVar19 * 2] = ppVar23[uVar19];
            ppVar23[uVar19 * 2 + -1] = pVar15;
          }
        }
        pVar15 = '\x10';
        sVar16 = 1;
      }
      pVar34 = '\x02';
    }
    row_info->channels = pVar34;
    row_info->pixel_depth = pVar15;
    row_info->rowbytes = (ulong)(uVar18 << sVar16);
    uVar37 = png_ptr->transformations;
  }
LAB_00112771:
  if ((uVar37 >> 0x11 & 1) != 0) {
    ppVar23 = png_ptr->row_buf;
    pVar12 = row_info->width;
    if (row_info->color_type == '\x04') {
      sVar8 = row_info->rowbytes;
      if (row_info->bit_depth == '\b') {
        for (lVar31 = 0; -pVar12 != (int)lVar31; lVar31 = lVar31 + -1) {
          puVar30 = (ushort *)(ppVar23 + lVar31 * 2 + (sVar8 - 1));
          *puVar30 = *puVar30 << 8 | *puVar30 >> 8;
        }
      }
      else {
        lVar31 = sVar8 - 3;
        for (lVar35 = 0; -pVar12 != (int)lVar35; lVar35 = lVar35 + -1) {
          auVar50 = pshuflw(ZEXT416(*(uint *)(ppVar23 + lVar35 * 4 + lVar31)),
                            ZEXT416(*(uint *)(ppVar23 + lVar35 * 4 + lVar31)),0xe1);
          *(int *)(ppVar23 + lVar35 * 4 + lVar31) = auVar50._0_4_;
        }
      }
    }
    else if (row_info->color_type == '\x06') {
      if (row_info->bit_depth == '\b') {
        lVar31 = row_info->rowbytes - 3;
        for (lVar35 = 0; -pVar12 != (int)lVar35; lVar35 = lVar35 + -1) {
          *(uint *)(ppVar23 + lVar35 * 4 + lVar31) =
               *(uint *)(ppVar23 + lVar35 * 4 + lVar31) << 8 |
               *(uint *)(ppVar23 + lVar35 * 4 + lVar31) >> 0x18;
        }
      }
      else {
        lVar31 = row_info->rowbytes - 7;
        for (lVar35 = 0; -pVar12 != (int)lVar35; lVar35 = lVar35 + -1) {
          auVar50._8_8_ = 0;
          auVar50._0_8_ = *(ulong *)(ppVar23 + lVar35 * 8 + lVar31);
          auVar50 = pshuflw(auVar50,auVar50,0x93);
          *(long *)(ppVar23 + lVar35 * 8 + lVar31) = auVar50._0_8_;
        }
      }
    }
  }
  uVar37 = png_ptr->transformations;
  if ((uVar37 & 0x10) != 0) {
    png_do_swap(row_info,png_ptr->row_buf + 1);
    uVar37 = png_ptr->transformations;
  }
  if ((uVar37 >> 0x14 & 1) != 0) {
    if (png_ptr->read_user_transform_fn != (png_user_transform_ptr)0x0) {
      (*png_ptr->read_user_transform_fn)(png_ptr,row_info,png_ptr->row_buf + 1);
    }
    if (png_ptr->user_transform_depth != '\0') {
      row_info->bit_depth = png_ptr->user_transform_depth;
    }
    pVar15 = png_ptr->user_transform_channels;
    if (pVar15 == '\0') {
      pVar15 = row_info->channels;
    }
    else {
      row_info->channels = pVar15;
    }
    bVar11 = pVar15 * row_info->bit_depth;
    row_info->pixel_depth = bVar11;
    if (bVar11 < 8) {
      uVar19 = (ulong)row_info->width * (ulong)bVar11 + 7 >> 3;
    }
    else {
      uVar19 = (ulong)row_info->width * (ulong)(bVar11 >> 3);
    }
    row_info->rowbytes = uVar19;
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_read_transformations(png_structrp png_ptr, png_row_infop row_info)
{
   png_debug(1, "in png_do_read_transformations");

   if (png_ptr->row_buf == NULL)
   {
      /* Prior to 1.5.4 this output row/pass where the NULL pointer is, but this
       * error is incredibly rare and incredibly easy to debug without this
       * information.
       */
      png_error(png_ptr, "NULL row buffer");
   }

   /* The following is debugging; prior to 1.5.4 the code was never compiled in;
    * in 1.5.4 PNG_FLAG_DETECT_UNINITIALIZED was added and the macro
    * PNG_WARN_UNINITIALIZED_ROW removed.  In 1.6 the new flag is set only for
    * all transformations, however in practice the ROW_INIT always gets done on
    * demand, if necessary.
    */
   if ((png_ptr->flags & PNG_FLAG_DETECT_UNINITIALIZED) != 0 &&
       (png_ptr->flags & PNG_FLAG_ROW_INIT) == 0)
   {
      /* Application has failed to call either png_read_start_image() or
       * png_read_update_info() after setting transforms that expand pixels.
       * This check added to libpng-1.2.19 (but not enabled until 1.5.4).
       */
      png_error(png_ptr, "Uninitialized row");
   }

#ifdef PNG_READ_EXPAND_SUPPORTED
   if ((png_ptr->transformations & PNG_EXPAND) != 0)
   {
      if (row_info->color_type == PNG_COLOR_TYPE_PALETTE)
      {
#ifdef PNG_ARM_NEON_INTRINSICS_AVAILABLE
         if ((png_ptr->num_trans > 0) && (png_ptr->bit_depth == 8))
         {
            if (png_ptr->riffled_palette == NULL)
            {
               /* Initialize the accelerated palette expansion. */
               png_ptr->riffled_palette =
                   (png_bytep)png_malloc(png_ptr, 256 * 4);
               png_riffle_palette_neon(png_ptr);
            }
         }
#endif
         png_do_expand_palette(png_ptr, row_info, png_ptr->row_buf + 1,
             png_ptr->palette, png_ptr->trans_alpha, png_ptr->num_trans);
      }

      else
      {
         if (png_ptr->num_trans != 0 &&
             (png_ptr->transformations & PNG_EXPAND_tRNS) != 0)
            png_do_expand(row_info, png_ptr->row_buf + 1,
                &(png_ptr->trans_color));

         else
            png_do_expand(row_info, png_ptr->row_buf + 1, NULL);
      }
   }
#endif

#ifdef PNG_READ_STRIP_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_STRIP_ALPHA) != 0 &&
       (png_ptr->transformations & PNG_COMPOSE) == 0 &&
       (row_info->color_type == PNG_COLOR_TYPE_RGB_ALPHA ||
       row_info->color_type == PNG_COLOR_TYPE_GRAY_ALPHA))
      png_do_strip_channel(row_info, png_ptr->row_buf + 1,
          0 /* at_start == false, because SWAP_ALPHA happens later */);
#endif

#ifdef PNG_READ_RGB_TO_GRAY_SUPPORTED
   if ((png_ptr->transformations & PNG_RGB_TO_GRAY) != 0)
   {
      int rgb_error =
          png_do_rgb_to_gray(png_ptr, row_info,
              png_ptr->row_buf + 1);

      if (rgb_error != 0)
      {
         png_ptr->rgb_to_gray_status=1;
         if ((png_ptr->transformations & PNG_RGB_TO_GRAY) ==
             PNG_RGB_TO_GRAY_WARN)
            png_warning(png_ptr, "png_do_rgb_to_gray found nongray pixel");

         if ((png_ptr->transformations & PNG_RGB_TO_GRAY) ==
             PNG_RGB_TO_GRAY_ERR)
            png_error(png_ptr, "png_do_rgb_to_gray found nongray pixel");
      }
   }
#endif

/* From Andreas Dilger e-mail to png-implement, 26 March 1998:
 *
 *   In most cases, the "simple transparency" should be done prior to doing
 *   gray-to-RGB, or you will have to test 3x as many bytes to check if a
 *   pixel is transparent.  You would also need to make sure that the
 *   transparency information is upgraded to RGB.
 *
 *   To summarize, the current flow is:
 *   - Gray + simple transparency -> compare 1 or 2 gray bytes and composite
 *                                   with background "in place" if transparent,
 *                                   convert to RGB if necessary
 *   - Gray + alpha -> composite with gray background and remove alpha bytes,
 *                                   convert to RGB if necessary
 *
 *   To support RGB backgrounds for gray images we need:
 *   - Gray + simple transparency -> convert to RGB + simple transparency,
 *                                   compare 3 or 6 bytes and composite with
 *                                   background "in place" if transparent
 *                                   (3x compare/pixel compared to doing
 *                                   composite with gray bkgrnd)
 *   - Gray + alpha -> convert to RGB + alpha, composite with background and
 *                                   remove alpha bytes (3x float
 *                                   operations/pixel compared with composite
 *                                   on gray background)
 *
 *  Greg's change will do this.  The reason it wasn't done before is for
 *  performance, as this increases the per-pixel operations.  If we would check
 *  in advance if the background was gray or RGB, and position the gray-to-RGB
 *  transform appropriately, then it would save a lot of work/time.
 */

#ifdef PNG_READ_GRAY_TO_RGB_SUPPORTED
   /* If gray -> RGB, do so now only if background is non-gray; else do later
    * for performance reasons
    */
   if ((png_ptr->transformations & PNG_GRAY_TO_RGB) != 0 &&
       (png_ptr->mode & PNG_BACKGROUND_IS_GRAY) == 0)
      png_do_gray_to_rgb(row_info, png_ptr->row_buf + 1);
#endif

#if defined(PNG_READ_BACKGROUND_SUPPORTED) ||\
   defined(PNG_READ_ALPHA_MODE_SUPPORTED)
   if ((png_ptr->transformations & PNG_COMPOSE) != 0)
      png_do_compose(row_info, png_ptr->row_buf + 1, png_ptr);
#endif

#ifdef PNG_READ_GAMMA_SUPPORTED
   if ((png_ptr->transformations & PNG_GAMMA) != 0 &&
#ifdef PNG_READ_RGB_TO_GRAY_SUPPORTED
      /* Because RGB_TO_GRAY does the gamma transform. */
      (png_ptr->transformations & PNG_RGB_TO_GRAY) == 0 &&
#endif
#if defined(PNG_READ_BACKGROUND_SUPPORTED) ||\
   defined(PNG_READ_ALPHA_MODE_SUPPORTED)
      /* Because PNG_COMPOSE does the gamma transform if there is something to
       * do (if there is an alpha channel or transparency.)
       */
       !((png_ptr->transformations & PNG_COMPOSE) != 0 &&
       ((png_ptr->num_trans != 0) ||
       (png_ptr->color_type & PNG_COLOR_MASK_ALPHA) != 0)) &&
#endif
      /* Because png_init_read_transformations transforms the palette, unless
       * RGB_TO_GRAY will do the transform.
       */
       (png_ptr->color_type != PNG_COLOR_TYPE_PALETTE))
      png_do_gamma(row_info, png_ptr->row_buf + 1, png_ptr);
#endif

#ifdef PNG_READ_STRIP_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_STRIP_ALPHA) != 0 &&
       (png_ptr->transformations & PNG_COMPOSE) != 0 &&
       (row_info->color_type == PNG_COLOR_TYPE_RGB_ALPHA ||
       row_info->color_type == PNG_COLOR_TYPE_GRAY_ALPHA))
      png_do_strip_channel(row_info, png_ptr->row_buf + 1,
          0 /* at_start == false, because SWAP_ALPHA happens later */);
#endif

#ifdef PNG_READ_ALPHA_MODE_SUPPORTED
   if ((png_ptr->transformations & PNG_ENCODE_ALPHA) != 0 &&
       (row_info->color_type & PNG_COLOR_MASK_ALPHA) != 0)
      png_do_encode_alpha(row_info, png_ptr->row_buf + 1, png_ptr);
#endif

#ifdef PNG_READ_SCALE_16_TO_8_SUPPORTED
   if ((png_ptr->transformations & PNG_SCALE_16_TO_8) != 0)
      png_do_scale_16_to_8(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_STRIP_16_TO_8_SUPPORTED
   /* There is no harm in doing both of these because only one has any effect,
    * by putting the 'scale' option first if the app asks for scale (either by
    * calling the API or in a TRANSFORM flag) this is what happens.
    */
   if ((png_ptr->transformations & PNG_16_TO_8) != 0)
      png_do_chop(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_QUANTIZE_SUPPORTED
   if ((png_ptr->transformations & PNG_QUANTIZE) != 0)
   {
      png_do_quantize(row_info, png_ptr->row_buf + 1,
          png_ptr->palette_lookup, png_ptr->quantize_index);

      if (row_info->rowbytes == 0)
         png_error(png_ptr, "png_do_quantize returned rowbytes=0");
   }
#endif /* READ_QUANTIZE */

#ifdef PNG_READ_EXPAND_16_SUPPORTED
   /* Do the expansion now, after all the arithmetic has been done.  Notice
    * that previous transformations can handle the PNG_EXPAND_16 flag if this
    * is efficient (particularly true in the case of gamma correction, where
    * better accuracy results faster!)
    */
   if ((png_ptr->transformations & PNG_EXPAND_16) != 0)
      png_do_expand_16(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_GRAY_TO_RGB_SUPPORTED
   /* NOTE: moved here in 1.5.4 (from much later in this list.) */
   if ((png_ptr->transformations & PNG_GRAY_TO_RGB) != 0 &&
       (png_ptr->mode & PNG_BACKGROUND_IS_GRAY) != 0)
      png_do_gray_to_rgb(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_INVERT_SUPPORTED
   if ((png_ptr->transformations & PNG_INVERT_MONO) != 0)
      png_do_invert(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_INVERT_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_INVERT_ALPHA) != 0)
      png_do_read_invert_alpha(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_SHIFT_SUPPORTED
   if ((png_ptr->transformations & PNG_SHIFT) != 0)
      png_do_unshift(row_info, png_ptr->row_buf + 1,
          &(png_ptr->shift));
#endif

#ifdef PNG_READ_PACK_SUPPORTED
   if ((png_ptr->transformations & PNG_PACK) != 0)
      png_do_unpack(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_CHECK_FOR_INVALID_INDEX_SUPPORTED
   /* Added at libpng-1.5.10 */
   if (row_info->color_type == PNG_COLOR_TYPE_PALETTE &&
       png_ptr->num_palette_max >= 0)
      png_do_check_palette_indexes(png_ptr, row_info);
#endif

#ifdef PNG_READ_BGR_SUPPORTED
   if ((png_ptr->transformations & PNG_BGR) != 0)
      png_do_bgr(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_PACKSWAP_SUPPORTED
   if ((png_ptr->transformations & PNG_PACKSWAP) != 0)
      png_do_packswap(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_FILLER_SUPPORTED
   if ((png_ptr->transformations & PNG_FILLER) != 0)
      png_do_read_filler(row_info, png_ptr->row_buf + 1,
          (png_uint_32)png_ptr->filler, png_ptr->flags);
#endif

#ifdef PNG_READ_SWAP_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_SWAP_ALPHA) != 0)
      png_do_read_swap_alpha(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_READ_16BIT_SUPPORTED
#ifdef PNG_READ_SWAP_SUPPORTED
   if ((png_ptr->transformations & PNG_SWAP_BYTES) != 0)
      png_do_swap(row_info, png_ptr->row_buf + 1);
#endif
#endif

#ifdef PNG_READ_USER_TRANSFORM_SUPPORTED
   if ((png_ptr->transformations & PNG_USER_TRANSFORM) != 0)
   {
      if (png_ptr->read_user_transform_fn != NULL)
         (*(png_ptr->read_user_transform_fn)) /* User read transform function */
             (png_ptr,     /* png_ptr */
             row_info,     /* row_info: */
                /*  png_uint_32 width;       width of row */
                /*  size_t rowbytes;         number of bytes in row */
                /*  png_byte color_type;     color type of pixels */
                /*  png_byte bit_depth;      bit depth of samples */
                /*  png_byte channels;       number of channels (1-4) */
                /*  png_byte pixel_depth;    bits per pixel (depth*channels) */
             png_ptr->row_buf + 1);    /* start of pixel data for row */
#ifdef PNG_USER_TRANSFORM_PTR_SUPPORTED
      if (png_ptr->user_transform_depth != 0)
         row_info->bit_depth = png_ptr->user_transform_depth;

      if (png_ptr->user_transform_channels != 0)
         row_info->channels = png_ptr->user_transform_channels;
#endif
      row_info->pixel_depth = (png_byte)(row_info->bit_depth *
          row_info->channels);

      row_info->rowbytes = PNG_ROWBYTES(row_info->pixel_depth, row_info->width);
   }
#endif
}